

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O0

sample_t * Timidity::resample_voice(Renderer *song,Voice *vp,int *countptr)

{
  ushort uVar1;
  int iVar2;
  WORD modes;
  int ofs;
  int *countptr_local;
  Voice *vp_local;
  Renderer *song_local;
  
  if (vp->sample->sample_rate == 0) {
    iVar2 = vp->sample_offset >> 0xc;
    if (*countptr < (vp->sample->data_length >> 0xc) - iVar2) {
      vp->sample_offset = *countptr * 0x1000 + vp->sample_offset;
    }
    else {
      vp->status = '\0';
      *countptr = (vp->sample->data_length >> 0xc) - iVar2;
    }
    song_local = (Renderer *)(vp->sample->data + iVar2);
  }
  else {
    uVar1 = vp->sample->modes;
    if (((vp->status & 0x10) != 0) && (vp->sample->loop_end - vp->sample->loop_start < 2)) {
      vp->status = vp->status & 0xef;
    }
    if (vp->vibrato_control_ratio == 0) {
      if ((vp->status & 0x10) == 0) {
        song_local = (Renderer *)rs_plain(song->resample_buffer,vp,countptr);
      }
      else if ((uVar1 & 8) == 0) {
        song_local = (Renderer *)rs_loop(song->resample_buffer,vp,*countptr);
      }
      else {
        song_local = (Renderer *)rs_bidir(song->resample_buffer,vp,*countptr);
      }
    }
    else if ((vp->status & 0x10) == 0) {
      song_local = (Renderer *)rs_vib_plain(song->resample_buffer,song->rate,vp,countptr);
    }
    else if ((uVar1 & 8) == 0) {
      song_local = (Renderer *)rs_vib_loop(song->resample_buffer,song->rate,vp,*countptr);
    }
    else {
      song_local = (Renderer *)rs_vib_bidir(song->resample_buffer,song->rate,vp,*countptr);
    }
  }
  return &song_local->rate;
}

Assistant:

sample_t *resample_voice(Renderer *song, Voice *vp, int *countptr)
{
	int ofs;
	WORD modes;

	if (vp->sample->sample_rate == 0)
	{
		/* Pre-resampled data -- just update the offset and check if
		we're out of data. */
		ofs = vp->sample_offset >> FRACTION_BITS; /* Kind of silly to use FRACTION_BITS here... */
		if (*countptr >= (vp->sample->data_length >> FRACTION_BITS) - ofs)
		{
			/* Note finished. Free the voice. */
			vp->status = 0;

			/* Let the caller know how much data we had left */
			*countptr = (vp->sample->data_length >> FRACTION_BITS) - ofs;
		}
		else
		{
			vp->sample_offset += *countptr << FRACTION_BITS;
		}
		return vp->sample->data + ofs;
	}

	/* Need to resample. Use the proper function. */
	modes = vp->sample->modes;

	if (vp->status & VOICE_LPE)
	{
		if (vp->sample->loop_end - vp->sample->loop_start < 2)
		{ // Loop is too short; turn it off.
			vp->status &= ~VOICE_LPE;
		}
	}

	if (vp->vibrato_control_ratio)
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_vib_bidir(song->resample_buffer, song->rate, vp, *countptr);
			else
				return rs_vib_loop(song->resample_buffer, song->rate, vp, *countptr);
		}
		else
		{
			return rs_vib_plain(song->resample_buffer, song->rate, vp, countptr);
		}
	}
	else
	{
		if (vp->status & VOICE_LPE)
		{
			if (modes & PATCH_BIDIR)
				return rs_bidir(song->resample_buffer, vp, *countptr);
			else
				return rs_loop(song->resample_buffer, vp, *countptr);
		}
		else
		{
			return rs_plain(song->resample_buffer, vp, countptr);
		}
	}
}